

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NavMoveRequestApplyResult(void)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  ImGuiID IVar4;
  ImGuiWindow_conflict *pIVar5;
  ImGuiContext_conflict1 *pIVar6;
  ImGuiNavItemData *pIVar7;
  ImVec2 IVar8;
  float fVar9;
  ImRect rect_abs;
  ImRect local_20;
  
  pIVar6 = GImGui;
  if ((GImGui->NavMoveResultLocal).ID == 0) {
    pIVar7 = (ImGuiNavItemData *)0x0;
    if ((GImGui->NavMoveResultOther).ID != 0) {
      pIVar7 = &GImGui->NavMoveResultOther;
    }
  }
  else {
    pIVar7 = &GImGui->NavMoveResultLocal;
  }
  uVar3 = GImGui->NavMoveFlags;
  if (pIVar7 == (ImGuiNavItemData *)0x0) {
    if ((uVar3 >> 9 & 1) != 0) {
      GImGui->NavMoveFlags = uVar3 | 0x800;
    }
    if (pIVar6->NavId == 0) {
      return;
    }
    if ((pIVar6->NavMoveFlags & 0x800) != 0) {
      return;
    }
    pIVar6->NavDisableHighlight = false;
    goto LAB_001dcedc;
  }
  if ((((uVar3 & 0x20) != 0) && (IVar4 = (GImGui->NavMoveResultLocalVisible).ID, IVar4 != 0)) &&
     (IVar4 != GImGui->NavId)) {
    pIVar7 = &GImGui->NavMoveResultLocalVisible;
  }
  if (((pIVar7 != &GImGui->NavMoveResultOther) && ((GImGui->NavMoveResultOther).ID != 0)) &&
     (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
    fVar9 = (GImGui->NavMoveResultOther).DistBox;
    fVar2 = pIVar7->DistBox;
    if (fVar2 <= fVar9) {
      if (((fVar9 != fVar2) || (NAN(fVar9) || NAN(fVar2))) ||
         (pfVar1 = &(GImGui->NavMoveResultOther).DistCenter,
         pIVar7->DistCenter < *pfVar1 || pIVar7->DistCenter == *pfVar1)) goto LAB_001dccf8;
    }
    pIVar7 = &GImGui->NavMoveResultOther;
  }
LAB_001dccf8:
  if ((GImGui->NavWindow == (ImGuiWindow_conflict *)0x0) ||
     (pIVar5 = pIVar7->Window, pIVar5 == (ImGuiWindow_conflict *)0x0)) {
    __assert_fail("g.NavWindow && result->Window",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x2804,"void ImGui::NavMoveRequestApplyResult()");
  }
  if (GImGui->NavLayer == ImGuiNavLayer_Main) {
    if ((uVar3 & 0x40) == 0) {
      local_20.Max.x = (pIVar7->Window->Pos).x;
      local_20.Max.y = (pIVar7->Window->Pos).y;
      local_20.Min.x = (pIVar7->RectRel).Min.x + local_20.Max.x;
      local_20.Min.y = (pIVar7->RectRel).Min.y + local_20.Max.y;
      local_20.Max.x = local_20.Max.x + (pIVar7->RectRel).Max.x;
      local_20.Max.y = local_20.Max.y + (pIVar7->RectRel).Max.y;
      IVar8 = ScrollToRectEx(pIVar7->Window,&local_20,GImGui->NavMoveScrollFlags);
    }
    else {
      fVar9 = 0.0;
      if (GImGui->NavMoveDir == 2) {
        fVar9 = (pIVar5->ScrollMax).y;
      }
      IVar8 = (ImVec2)((ulong)(uint)((pIVar5->Scroll).y - fVar9) << 0x20);
      (pIVar5->ScrollTarget).y = fVar9;
      (pIVar5->ScrollTargetCenterRatio).y = 0.0;
      (pIVar5->ScrollTargetEdgeSnapDist).y = 0.0;
    }
    fVar9 = (pIVar7->RectRel).Min.y;
    (pIVar7->RectRel).Min.x = (pIVar7->RectRel).Min.x - IVar8.x;
    (pIVar7->RectRel).Max.x = (pIVar7->RectRel).Max.x - IVar8.x;
    (pIVar7->RectRel).Min.y = fVar9 - IVar8.y;
    (pIVar7->RectRel).Max.y = (pIVar7->RectRel).Max.y - IVar8.y;
  }
  ClearActiveID();
  pIVar6->NavWindow = pIVar7->Window;
  IVar4 = pIVar7->ID;
  if (pIVar6->NavId != IVar4) {
    pIVar6->NavJustMovedToId = IVar4;
    pIVar6->NavJustMovedToFocusScopeId = pIVar7->FocusScopeId;
    pIVar6->NavJustMovedToKeyMods = pIVar6->NavMoveKeyMods;
  }
  SetNavID(IVar4,pIVar6->NavLayer,pIVar7->FocusScopeId,&pIVar7->RectRel);
  if ((((uint)pIVar6->NavMoveFlags >> 9 & 1) != 0) && ((pIVar7->InFlags & 0x100) != 0)) {
    pIVar6->NavNextActivateId = pIVar7->ID;
    pIVar6->NavNextActivateFlags = 5;
    pIVar6->NavMoveFlags = pIVar6->NavMoveFlags | 0x800;
  }
  if (((uint)pIVar6->NavMoveFlags >> 10 & 1) != 0) {
    pIVar6->NavNextActivateId = pIVar7->ID;
    pIVar6->NavNextActivateFlags = 0;
  }
  if (((uint)pIVar6->NavMoveFlags >> 0xb & 1) != 0) {
    return;
  }
  pIVar6->NavMousePosDirty = true;
  pIVar6->NavDisableHighlight = false;
LAB_001dcedc:
  pIVar6->NavDisableMouseHover = true;
  return;
}

Assistant:

void ImGui::NavMoveRequestApplyResult()
{
    ImGuiContext& g = *GImGui;
#if IMGUI_DEBUG_NAV_SCORING
    if (g.NavMoveFlags & ImGuiNavMoveFlags_DebugNoResult) // [DEBUG] Scoring all items in NavWindow at all times
        return;
#endif

    // Select which result to use
    ImGuiNavItemData* result = (g.NavMoveResultLocal.ID != 0) ? &g.NavMoveResultLocal : (g.NavMoveResultOther.ID != 0) ? &g.NavMoveResultOther : NULL;

    // In a situation when there is no results but NavId != 0, re-enable the Navigation highlight (because g.NavId is not considered as a possible result)
    if (result == NULL)
    {
        if (g.NavMoveFlags & ImGuiNavMoveFlags_Tabbing)
            g.NavMoveFlags |= ImGuiNavMoveFlags_DontSetNavHighlight;
        if (g.NavId != 0 && (g.NavMoveFlags & ImGuiNavMoveFlags_DontSetNavHighlight) == 0)
        {
            g.NavDisableHighlight = false;
            g.NavDisableMouseHover = true;
        }
        return;
    }

    // PageUp/PageDown behavior first jumps to the bottom/top mostly visible item, _otherwise_ use the result from the previous/next page.
    if (g.NavMoveFlags & ImGuiNavMoveFlags_AlsoScoreVisibleSet)
        if (g.NavMoveResultLocalVisible.ID != 0 && g.NavMoveResultLocalVisible.ID != g.NavId)
            result = &g.NavMoveResultLocalVisible;

    // Maybe entering a flattened child from the outside? In this case solve the tie using the regular scoring rules.
    if (result != &g.NavMoveResultOther && g.NavMoveResultOther.ID != 0 && g.NavMoveResultOther.Window->ParentWindow == g.NavWindow)
        if ((g.NavMoveResultOther.DistBox < result->DistBox) || (g.NavMoveResultOther.DistBox == result->DistBox && g.NavMoveResultOther.DistCenter < result->DistCenter))
            result = &g.NavMoveResultOther;
    IM_ASSERT(g.NavWindow && result->Window);

    // Scroll to keep newly navigated item fully into view.
    if (g.NavLayer == ImGuiNavLayer_Main)
    {
        ImVec2 delta_scroll;
        if (g.NavMoveFlags & ImGuiNavMoveFlags_ScrollToEdgeY)
        {
            // FIXME: Should remove this
            float scroll_target = (g.NavMoveDir == ImGuiDir_Up) ? result->Window->ScrollMax.y : 0.0f;
            delta_scroll.y = result->Window->Scroll.y - scroll_target;
            SetScrollY(result->Window, scroll_target);
        }
        else
        {
            ImRect rect_abs = ImRect(result->RectRel.Min + result->Window->Pos, result->RectRel.Max + result->Window->Pos);
            delta_scroll = ScrollToRectEx(result->Window, rect_abs, g.NavMoveScrollFlags);
        }

        // Offset our result position so mouse position can be applied immediately after in NavUpdate()
        result->RectRel.TranslateX(-delta_scroll.x);
        result->RectRel.TranslateY(-delta_scroll.y);
    }

    ClearActiveID();
    g.NavWindow = result->Window;
    if (g.NavId != result->ID)
    {
        // Don't set NavJustMovedToId if just landed on the same spot (which may happen with ImGuiNavMoveFlags_AllowCurrentNavId)
        g.NavJustMovedToId = result->ID;
        g.NavJustMovedToFocusScopeId = result->FocusScopeId;
        g.NavJustMovedToKeyMods = g.NavMoveKeyMods;
    }

    // Focus
    IMGUI_DEBUG_LOG_NAV("[nav] NavMoveRequest: result NavID 0x%08X in Layer %d Window \"%s\"\n", result->ID, g.NavLayer, g.NavWindow->Name);
    SetNavID(result->ID, g.NavLayer, result->FocusScopeId, result->RectRel);

    // Tabbing: Activates Inputable or Focus non-Inputable
    if ((g.NavMoveFlags & ImGuiNavMoveFlags_Tabbing) && (result->InFlags & ImGuiItemFlags_Inputable))
    {
        g.NavNextActivateId = result->ID;
        g.NavNextActivateFlags = ImGuiActivateFlags_PreferInput | ImGuiActivateFlags_TryToPreserveState;
        g.NavMoveFlags |= ImGuiNavMoveFlags_DontSetNavHighlight;
    }

    // Activate
    if (g.NavMoveFlags & ImGuiNavMoveFlags_Activate)
    {
        g.NavNextActivateId = result->ID;
        g.NavNextActivateFlags = ImGuiActivateFlags_None;
    }

    // Enable nav highlight
    if ((g.NavMoveFlags & ImGuiNavMoveFlags_DontSetNavHighlight) == 0)
    {
        g.NavDisableHighlight = false;
        g.NavDisableMouseHover = g.NavMousePosDirty = true;
    }
}